

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O3

void __thiscall slang::ast::ScriptSession::evalStatement(ScriptSession *this,StatementSyntax *stmt)

{
  StatementBlockSymbol *this_00;
  Statement *this_01;
  StatementContext stmtCtx;
  StatementContext local_78;
  ASTContext local_48;
  
  this_00 = StatementBlockSymbol::fromLabeledStmt(&this->scope->super_Scope,stmt);
  Scope::insertMember(&this->scope->super_Scope,&this_00->super_Symbol,
                      (this->scope->super_Scope).lastMember,false,true);
  local_48.scope.ptr = &this->scope->super_Scope;
  local_78.rootAstContext = &local_48;
  local_48.lookupIndex = 0xffffffff;
  local_48.flags.m_bits = 0;
  local_48.instanceOrProc = (Symbol *)0x0;
  local_48.firstTempVar = (TempVarSymbol *)0x0;
  local_48.randomizeDetails = (RandomizeDetails *)0x0;
  local_48.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_78.lastEventControl.startLoc = (SourceLocation)0x0;
  local_78.lastEventControl.endLoc = (SourceLocation)0x0;
  local_78.blocks._M_ptr = (pointer)0x0;
  local_78.blocks._M_extent._M_extent_value = 0;
  local_78.flags.m_bits = 0;
  this_01 = StatementBlockSymbol::getStatement(this_00,local_78.rootAstContext,&local_78);
  Statement::eval(this_01,&this->evalContext);
  Statement::StatementContext::~StatementContext(&local_78);
  return;
}

Assistant:

void ScriptSession::evalStatement(const StatementSyntax& stmt) {
    auto& block = StatementBlockSymbol::fromLabeledStmt(scope, stmt);
    scope.addMember(block);

    ASTContext context(scope, LookupLocation::max);
    Statement::StatementContext stmtCtx(context);
    block.getStatement(context, stmtCtx).eval(evalContext);
}